

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcSort.c
# Opt level: O2

Mvc_Cube_t *
Mvc_CoverSort_rec(Mvc_Cube_t *pList,int nItems,Mvc_Cube_t *pMask,
                 _func_int_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr *pCompareFunc)

{
  int nItems_00;
  Mvc_Cube_t *pList1;
  Mvc_Cube_t *pMVar1;
  int iVar2;
  ulong uVar3;
  
  if (nItems != 1) {
    nItems_00 = (int)((long)nItems / 2);
    uVar3 = 0;
    pMVar1 = pList;
    if (0 < nItems_00) {
      uVar3 = (long)nItems / 2 & 0xffffffff;
    }
    while (iVar2 = (int)uVar3, uVar3 = (ulong)(iVar2 - 1), iVar2 != 0) {
      pMVar1 = pMVar1->pNext;
    }
    pList1 = Mvc_CoverSort_rec(pList,nItems_00,pMask,pCompareFunc);
    pMVar1 = Mvc_CoverSort_rec(pMVar1,nItems - nItems_00,pMask,pCompareFunc);
    pMVar1 = Mvc_CoverSortMerge(pList1,pMVar1,pMask,pCompareFunc);
    return pMVar1;
  }
  pList->pNext = (Mvc_Cube_t *)0x0;
  return pList;
}

Assistant:

Mvc_Cube_t * Mvc_CoverSort_rec( Mvc_Cube_t * pList, int nItems, Mvc_Cube_t * pMask, int (* pCompareFunc)(Mvc_Cube_t *, Mvc_Cube_t *, Mvc_Cube_t *) )
{
    Mvc_Cube_t * pList1, * pList2;
    int nItems1, nItems2, i;

    // trivial case
    if ( nItems == 1 )
    {
        Mvc_CubeSetNext( pList, NULL );
        return pList;
    }

    // select the new sizes
    nItems1 = nItems/2;
    nItems2 = nItems - nItems1;

    // set the new beginnings
    pList1 = pList2 = pList;
    for ( i = 0; i < nItems1; i++ )
        pList2 = Mvc_CubeReadNext( pList2 );

    // solve recursively
    pList1 = Mvc_CoverSort_rec( pList1, nItems1, pMask, pCompareFunc );
    pList2 = Mvc_CoverSort_rec( pList2, nItems2, pMask, pCompareFunc );

    // merge
    return Mvc_CoverSortMerge( pList1, pList2, pMask, pCompareFunc );
}